

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall QBoxLayoutPrivate::setupGeom(QBoxLayoutPrivate *this)

{
  QBoxLayoutItem *pQVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  Int IVar5;
  int iVar6;
  uint uVar7;
  Int IVar8;
  QBoxLayout *pQVar9;
  qsizetype qVar10;
  QWidget *pQVar11;
  const_reference ppQVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pQVar13;
  undefined4 extraout_var_02;
  int *piVar14;
  QBoxLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  bool expand_1;
  bool expand;
  bool ignore;
  int spacing;
  bool empty;
  QBoxLayoutItem *box;
  int i;
  QWidget *parentWidget;
  QStyle *style;
  int previousNonEmptyIndex;
  int fixedSpacing;
  int n;
  QBoxLayout *q;
  QSize extra;
  int bottom;
  int right;
  int top;
  int left;
  bool dummy;
  ControlTypes actual2;
  ControlTypes actual1;
  Orientations exp;
  QSize hint;
  QSize min;
  QSize max;
  ControlTypes controlTypes2;
  ControlTypes controlTypes1;
  QList<QLayoutStruct> a;
  bool verexp;
  bool horexp;
  int hinth;
  int hintw;
  int minh;
  int minw;
  int maxh;
  int maxw;
  undefined2 in_stack_fffffffffffffe48;
  byte in_stack_fffffffffffffe4a;
  byte in_stack_fffffffffffffe4b;
  Orientation in_stack_fffffffffffffe4c;
  Orientation in_stack_fffffffffffffe50;
  QFlag in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined2 in_stack_fffffffffffffe60;
  byte in_stack_fffffffffffffe62;
  undefined1 in_stack_fffffffffffffe63;
  int in_stack_fffffffffffffe64;
  Int in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  Int in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  Orientation in_stack_fffffffffffffe78;
  Orientation in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe8c;
  QFlagsStorage<QSizePolicy::ControlType> in_stack_fffffffffffffe98;
  QFlagsStorage<QSizePolicy::ControlType> in_stack_fffffffffffffe9c;
  bool local_15f;
  bool local_15e;
  Int local_14c;
  Int local_138;
  int local_124;
  QStyle *local_118;
  int local_10c;
  int local_e4 [6];
  QSize local_cc;
  QSize local_c4;
  QSize local_b4;
  QSize local_ac;
  QFlag local_a4;
  Int local_a0;
  int local_9c;
  int local_98;
  QFlagsStorageHelper<Qt::Orientation,_4> local_94;
  QFlagsStorageHelper<Qt::Orientation,_4> local_90;
  int local_8c;
  int local_88;
  QFlagsStorageHelper<Qt::Orientation,_4> local_84;
  QFlagsStorageHelper<Qt::Orientation,_4> local_80;
  undefined1 local_79;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  int local_48;
  int local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  byte local_22;
  bool local_21;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)in_RDI->field_0x118 >> 1 & 1) != 0) {
    pQVar9 = q_func(in_RDI);
    bVar2 = horz(in_RDI->dir);
    local_c = 0x7ffff;
    if (bVar2) {
      local_c = 0;
    }
    bVar2 = horz(in_RDI->dir);
    local_10 = 0;
    if (bVar2) {
      local_10 = 0x7ffff;
    }
    local_14 = 0;
    local_18 = 0;
    local_1c = 0;
    local_20 = 0;
    local_21 = false;
    local_22 = 0;
    in_RDI->field_0x118 = in_RDI->field_0x118 & 0xfe;
    qVar10 = QList<QBoxLayoutItem_*>::size(&in_RDI->list);
    QList<QLayoutStruct>::clear
              ((QList<QLayoutStruct> *)
               CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50));
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QLayoutStruct>::QList
              ((QList<QLayoutStruct> *)
               CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
               CONCAT44(in_stack_fffffffffffffe4c,
                        CONCAT13(in_stack_fffffffffffffe4b,
                                 CONCAT12(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48))));
    local_44 = -0x55555556;
    QFlags<QSizePolicy::ControlType>::QFlags((QFlags<QSizePolicy::ControlType> *)0x2f28ac);
    local_48 = -0x55555556;
    QFlags<QSizePolicy::ControlType>::QFlags((QFlags<QSizePolicy::ControlType> *)0x2f28c6);
    IVar5 = (**(code **)(*(long *)&pQVar9->super_QLayout + 0x60))();
    local_10c = -1;
    local_118 = (QStyle *)0x0;
    if (((int)IVar5 < 0) &&
       (pQVar11 = QLayout::parentWidget
                            ((QLayout *)
                             CONCAT44(in_stack_fffffffffffffe64,
                                      CONCAT13(in_stack_fffffffffffffe63,
                                               CONCAT12(in_stack_fffffffffffffe62,
                                                        in_stack_fffffffffffffe60)))),
       pQVar11 != (QWidget *)0x0)) {
      local_118 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffe4c,
                                          CONCAT13(in_stack_fffffffffffffe4b,
                                                   CONCAT12(in_stack_fffffffffffffe4a,
                                                            in_stack_fffffffffffffe48))));
    }
    for (local_124 = 0; local_124 < (int)qVar10; local_124 = local_124 + 1) {
      ppQVar12 = QList<QBoxLayoutItem_*>::at
                           ((QList<QBoxLayoutItem_*> *)
                            CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                            CONCAT44(in_stack_fffffffffffffe4c,
                                     CONCAT13(in_stack_fffffffffffffe4b,
                                              CONCAT12(in_stack_fffffffffffffe4a,
                                                       in_stack_fffffffffffffe48))));
      pQVar1 = *ppQVar12;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      iVar6 = (*pQVar1->item->_vptr_QLayoutItem[4])();
      local_50 = (undefined1 *)CONCAT44(extraout_var,iVar6);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      iVar6 = (*pQVar1->item->_vptr_QLayoutItem[3])();
      local_58 = (undefined1 *)CONCAT44(extraout_var_00,iVar6);
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      iVar6 = (*pQVar1->item->_vptr_QLayoutItem[2])();
      local_60 = (undefined1 *)CONCAT44(extraout_var_01,iVar6);
      local_64 = 0xaaaaaaaa;
      local_64 = (*pQVar1->item->_vptr_QLayoutItem[5])();
      uVar7 = (*pQVar1->item->_vptr_QLayoutItem[8])();
      bVar3 = (byte)uVar7 & 1;
      local_138 = 0;
      if ((uVar7 & 1) == 0) {
        if ((int)IVar5 < 0) {
          local_44 = local_48;
          local_68 = (*pQVar1->item->_vptr_QLayoutItem[0x10])();
          local_48 = local_68;
          if (-1 < local_10c) {
            local_6c = local_44;
            local_70 = local_68;
            if ((in_RDI->dir == RightToLeft) || (in_RDI->dir == BottomToTop)) {
              qSwap<QFlags<QSizePolicy::ControlType>>
                        ((QFlags<QSizePolicy::ControlType> *)
                         CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                         (QFlags<QSizePolicy::ControlType> *)
                         CONCAT44(in_stack_fffffffffffffe4c,
                                  CONCAT13(in_stack_fffffffffffffe4b,
                                           CONCAT12(in_stack_fffffffffffffe4a,
                                                    in_stack_fffffffffffffe48))));
            }
            if (local_118 != (QStyle *)0x0) {
              local_74 = local_6c;
              local_78 = local_70;
              horz(in_RDI->dir);
              QLayout::parentWidget
                        ((QLayout *)
                         CONCAT44(in_stack_fffffffffffffe64,
                                  CONCAT13(in_stack_fffffffffffffe63,
                                           CONCAT12(in_stack_fffffffffffffe62,
                                                    in_stack_fffffffffffffe60))));
              local_138 = QStyle::combinedLayoutSpacing
                                    ((QStyle *)
                                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                     in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98.i,
                                     in_stack_fffffffffffffe7c,
                                     (QStyleOption *)
                                     CONCAT17(in_stack_fffffffffffffe77,
                                              CONCAT16(in_stack_fffffffffffffe76,
                                                       CONCAT24(in_stack_fffffffffffffe74,
                                                                in_stack_fffffffffffffe70))),
                                     (QWidget *)
                                     CONCAT17(in_stack_fffffffffffffe6f,
                                              CONCAT16(in_stack_fffffffffffffe6e,
                                                       CONCAT24(in_stack_fffffffffffffe6c,
                                                                in_stack_fffffffffffffe68))));
              if ((int)local_138 < 0) {
                local_138 = 0;
              }
            }
          }
        }
        else {
          local_14c = IVar5;
          if (local_10c < 0) {
            local_14c = 0;
          }
          local_138 = local_14c;
        }
        if (-1 < local_10c) {
          pQVar13 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                               CONCAT44(in_stack_fffffffffffffe4c,
                                        CONCAT13(in_stack_fffffffffffffe4b,
                                                 CONCAT12(in_stack_fffffffffffffe4a,
                                                          in_stack_fffffffffffffe48))));
          pQVar13->spacing = local_138;
        }
        local_10c = local_124;
      }
      bVar2 = false;
      if ((uVar7 & 1) != 0) {
        iVar6 = (*pQVar1->item->_vptr_QLayoutItem[0xd])();
        bVar2 = CONCAT44(extraout_var_02,iVar6) != 0;
      }
      local_79 = 1;
      bVar4 = horz(in_RDI->dir);
      if (bVar4) {
        local_80.super_QFlagsStorage<Qt::Orientation>.i =
             (QFlagsStorage<Qt::Orientation>)
             QFlags<Qt::Orientation>::operator&
                       ((QFlags<Qt::Orientation> *)
                        CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe4c);
        IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_80);
        local_15e = true;
        if (IVar8 == 0) {
          local_15e = 0 < pQVar1->stretch;
        }
        local_15f = true;
        if ((local_21 & 1U) == 0) {
          local_15f = local_15e;
        }
        local_21 = local_15f;
        iVar6 = QSize::width((QSize *)0x2f2d00);
        local_c = local_138 + iVar6 + local_c;
        in_stack_fffffffffffffe98.i = local_138;
        iVar6 = QSize::width((QSize *)0x2f2d2e);
        local_14 = in_stack_fffffffffffffe98.i + iVar6 + local_14;
        in_stack_fffffffffffffe9c.i = local_138;
        iVar6 = QSize::width((QSize *)0x2f2d5c);
        local_1c = in_stack_fffffffffffffe9c.i + iVar6 + local_1c;
        local_138 = in_stack_fffffffffffffe70;
        if (!bVar2) {
          QSize::height((QSize *)0x2f2d8a);
          local_84.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFlags<Qt::Orientation>::operator&
                         ((QFlags<Qt::Orientation> *)
                          CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe4c);
          IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
          in_stack_fffffffffffffe8c = CONCAT13(IVar8 != 0,(int3)in_stack_fffffffffffffe8c);
          (*pQVar1->item->_vptr_QLayoutItem[8])();
          qMaxExpCalc((int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      (bool *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      (bool *)CONCAT17(in_stack_fffffffffffffe77,
                                       CONCAT16(in_stack_fffffffffffffe76,
                                                CONCAT24(in_stack_fffffffffffffe74,
                                                         in_stack_fffffffffffffe70))),
                      in_stack_fffffffffffffe8c,(bool)in_stack_fffffffffffffe6f,
                      (bool)in_stack_fffffffffffffe6e);
          local_138 = in_stack_fffffffffffffe70;
        }
        local_88 = QSize::height((QSize *)0x2f2e11);
        piVar14 = qMax<int>(&local_18,&local_88);
        local_18 = *piVar14;
        local_8c = QSize::height((QSize *)0x2f2e43);
        piVar14 = qMax<int>(&local_20,&local_8c);
        local_20 = *piVar14;
        in_stack_fffffffffffffe80 = QSize::width((QSize *)0x2f2e75);
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->sizeHint = in_stack_fffffffffffffe80;
        in_stack_fffffffffffffe84 = QSize::width((QSize *)0x2f2ea2);
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->maximumSize = in_stack_fffffffffffffe84;
        iVar6 = QSize::width((QSize *)0x2f2ecf);
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->minimumSize = iVar6;
        in_stack_fffffffffffffe8c =
             CONCAT13((char)((uint)in_stack_fffffffffffffe8c >> 0x18),
                      CONCAT12(local_15e,(short)in_stack_fffffffffffffe8c));
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->expansive = (bool)((byte)((uint)in_stack_fffffffffffffe8c >> 0x10) & 1);
        if (pQVar1->stretch == 0) {
          in_stack_fffffffffffffe78 =
               QBoxLayoutItem::hStretch
                         ((QBoxLayoutItem *)
                          CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50));
        }
        else {
          in_stack_fffffffffffffe78 = pQVar1->stretch;
        }
        in_stack_fffffffffffffe7c = in_stack_fffffffffffffe78;
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->stretch = in_stack_fffffffffffffe78;
      }
      else {
        local_90.super_QFlagsStorage<Qt::Orientation>.i =
             (QFlagsStorage<Qt::Orientation>)
             QFlags<Qt::Orientation>::operator&
                       ((QFlags<Qt::Orientation> *)
                        CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe4c);
        IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_90);
        in_stack_fffffffffffffe62 = true;
        if (IVar8 == 0) {
          in_stack_fffffffffffffe62 = 0 < pQVar1->stretch;
        }
        in_stack_fffffffffffffe76 = true;
        if ((local_22 & 1) == 0) {
          in_stack_fffffffffffffe76 = in_stack_fffffffffffffe62;
        }
        in_stack_fffffffffffffe68 = local_138;
        in_stack_fffffffffffffe77 = in_stack_fffffffffffffe62;
        local_22 = in_stack_fffffffffffffe76;
        iVar6 = QSize::height((QSize *)0x2f2ffb);
        local_10 = in_stack_fffffffffffffe68 + iVar6 + local_10;
        in_stack_fffffffffffffe6c = (undefined2)local_138;
        in_stack_fffffffffffffe6e = (undefined1)(local_138 >> 0x10);
        in_stack_fffffffffffffe6f = (undefined1)(local_138 >> 0x18);
        iVar6 = QSize::height((QSize *)0x2f3029);
        local_18 = CONCAT13(in_stack_fffffffffffffe6f,
                            CONCAT12(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe6c)) + iVar6 +
                   local_18;
        iVar6 = QSize::height((QSize *)0x2f3057);
        local_20 = local_138 + iVar6 + local_20;
        if (!bVar2) {
          in_stack_fffffffffffffe64 = QSize::width((QSize *)0x2f3085);
          local_94.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFlags<Qt::Orientation>::operator&
                         ((QFlags<Qt::Orientation> *)
                          CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe4c);
          IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_94);
          in_stack_fffffffffffffe63 = IVar8 != 0;
          (*pQVar1->item->_vptr_QLayoutItem[8])();
          qMaxExpCalc((int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      (bool *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      (bool *)CONCAT17(in_stack_fffffffffffffe77,
                                       CONCAT16(in_stack_fffffffffffffe76,
                                                CONCAT24(in_stack_fffffffffffffe74,local_138))),
                      in_stack_fffffffffffffe8c,(bool)in_stack_fffffffffffffe6f,
                      (bool)in_stack_fffffffffffffe6e);
        }
        local_98 = QSize::width((QSize *)0x2f310c);
        piVar14 = qMax<int>(&local_14,&local_98);
        local_14 = *piVar14;
        local_9c = QSize::width((QSize *)0x2f313e);
        piVar14 = qMax<int>(&local_1c,&local_9c);
        local_1c = *piVar14;
        in_stack_fffffffffffffe54.i = QSize::height((QSize *)0x2f3170);
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->sizeHint = in_stack_fffffffffffffe54.i;
        in_stack_fffffffffffffe58 = QSize::height((QSize *)0x2f319d);
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->maximumSize = in_stack_fffffffffffffe58;
        in_stack_fffffffffffffe5c = QSize::height((QSize *)0x2f31ca);
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->minimumSize = in_stack_fffffffffffffe5c;
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->expansive = (bool)(in_stack_fffffffffffffe62 & 1);
        if (pQVar1->stretch == 0) {
          in_stack_fffffffffffffe4c =
               QBoxLayoutItem::vStretch
                         ((QBoxLayoutItem *)
                          CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50));
        }
        else {
          in_stack_fffffffffffffe4c = pQVar1->stretch;
        }
        in_stack_fffffffffffffe50 = in_stack_fffffffffffffe4c;
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe4c),
                             CONCAT44(in_stack_fffffffffffffe4c,
                                      CONCAT13(in_stack_fffffffffffffe4b,
                                               CONCAT12(in_stack_fffffffffffffe4a,
                                                        in_stack_fffffffffffffe48))));
        pQVar13->stretch = in_stack_fffffffffffffe4c;
      }
      pQVar13 = QList<QLayoutStruct>::operator[]
                          ((QList<QLayoutStruct> *)
                           CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                           CONCAT44(in_stack_fffffffffffffe4c,
                                    CONCAT13(in_stack_fffffffffffffe4b,
                                             CONCAT12((byte)uVar7,in_stack_fffffffffffffe48))) &
                           0xffffffffff01ffff);
      pQVar13->empty = (bool)(bVar3 & 1);
      pQVar13 = QList<QLayoutStruct>::operator[]
                          ((QList<QLayoutStruct> *)
                           CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                           CONCAT44(in_stack_fffffffffffffe4c,
                                    CONCAT13(in_stack_fffffffffffffe4b,
                                             CONCAT12(bVar3,in_stack_fffffffffffffe48))));
      pQVar13->spacing = 0;
      in_stack_fffffffffffffe4b = 1;
      if ((in_RDI->field_0x118 & 1) == 0) {
        iVar6 = (*pQVar1->item->_vptr_QLayoutItem[9])();
        in_stack_fffffffffffffe4b = (byte)iVar6;
      }
      in_RDI->field_0x118 = in_RDI->field_0x118 & 0xfe | in_stack_fffffffffffffe4b & 1;
      in_stack_fffffffffffffe4a = bVar3;
      in_stack_fffffffffffffe70 = local_138;
    }
    QList<QLayoutStruct>::operator=
              ((QList<QLayoutStruct> *)
               CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
               (QList<QLayoutStruct> *)
               CONCAT44(in_stack_fffffffffffffe4c,
                        CONCAT13(in_stack_fffffffffffffe4b,
                                 CONCAT12(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48))));
    uVar7 = 0;
    if ((local_22 & 1) != 0) {
      uVar7 = 2;
    }
    QFlag::QFlag(&local_a4,(local_21 & 1U) != 0 | uVar7);
    QFlags<Qt::Orientation>::QFlagsStorageHelper
              ((QFlags<Qt::Orientation> *)
               CONCAT44(in_stack_fffffffffffffe4c,
                        CONCAT13(in_stack_fffffffffffffe4b,
                                 CONCAT12(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48))),
               in_stack_fffffffffffffe54);
    (in_RDI->expanding).super_QFlagsStorageHelper<Qt::Orientation,_4>.
    super_QFlagsStorage<Qt::Orientation>.i = local_a0;
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c,
                 CONCAT13(in_stack_fffffffffffffe4b,
                          CONCAT12(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48)));
    in_RDI->minSize = local_ac;
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c,
                 CONCAT13(in_stack_fffffffffffffe4b,
                          CONCAT12(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48)));
    local_b4 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffe5c,
                                                   in_stack_fffffffffffffe58),
                                 (QSize *)CONCAT44(in_stack_fffffffffffffe54.i,
                                                   in_stack_fffffffffffffe50));
    in_RDI->maxSize = local_b4;
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c,
                 CONCAT13(in_stack_fffffffffffffe4b,
                          CONCAT12(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48)));
    local_cc = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffe5c,
                                                   in_stack_fffffffffffffe58),
                                 (QSize *)CONCAT44(in_stack_fffffffffffffe54.i,
                                                   in_stack_fffffffffffffe50));
    local_c4 = QSize::boundedTo((QSize *)CONCAT44(in_stack_fffffffffffffe5c,
                                                  in_stack_fffffffffffffe58),
                                (QSize *)CONCAT44(in_stack_fffffffffffffe54.i,
                                                  in_stack_fffffffffffffe50));
    in_RDI->sizeHint = local_c4;
    QLayout::getContentsMargins
              ((QLayout *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,
                                 CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))),
               (int *)CONCAT17(in_stack_fffffffffffffe6f,
                               CONCAT16(in_stack_fffffffffffffe6e,
                                        CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ))),
               (int *)CONCAT44(in_stack_fffffffffffffe64,
                               CONCAT13(in_stack_fffffffffffffe63,
                                        CONCAT12(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60
                                                ))),
               (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (int *)CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50));
    local_e4[3] = 0xaaaaaaaa;
    local_e4[2] = 0xaaaaaaaa;
    local_e4[1] = 0xaaaaaaaa;
    local_e4[0] = -0x55555556;
    effectiveMargins(in_RDI,local_e4 + 3,local_e4 + 2,local_e4 + 1,local_e4);
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c,
                 CONCAT13(in_stack_fffffffffffffe4b,
                          CONCAT12(in_stack_fffffffffffffe4a,in_stack_fffffffffffffe48)));
    QSize::operator+=((QSize *)CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                      (QSize *)CONCAT44(in_stack_fffffffffffffe4c,
                                        CONCAT13(in_stack_fffffffffffffe4b,
                                                 CONCAT12(in_stack_fffffffffffffe4a,
                                                          in_stack_fffffffffffffe48))));
    QSize::operator+=((QSize *)CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                      (QSize *)CONCAT44(in_stack_fffffffffffffe4c,
                                        CONCAT13(in_stack_fffffffffffffe4b,
                                                 CONCAT12(in_stack_fffffffffffffe4a,
                                                          in_stack_fffffffffffffe48))));
    QSize::operator+=((QSize *)CONCAT44(in_stack_fffffffffffffe54.i,in_stack_fffffffffffffe50),
                      (QSize *)CONCAT44(in_stack_fffffffffffffe4c,
                                        CONCAT13(in_stack_fffffffffffffe4b,
                                                 CONCAT12(in_stack_fffffffffffffe4a,
                                                          in_stack_fffffffffffffe48))));
    in_RDI->field_0x118 = in_RDI->field_0x118 & 0xfd;
    QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x2f35b0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayoutPrivate::setupGeom()
{
    if (!dirty)
        return;

    Q_Q(QBoxLayout);
    int maxw = horz(dir) ? 0 : QLAYOUTSIZE_MAX;
    int maxh = horz(dir) ? QLAYOUTSIZE_MAX : 0;
    int minw = 0;
    int minh = 0;
    int hintw = 0;
    int hinth = 0;

    bool horexp = false;
    bool verexp = false;

    hasHfw = false;

    int n = list.size();
    geomArray.clear();
    QList<QLayoutStruct> a(n);

    QSizePolicy::ControlTypes controlTypes1;
    QSizePolicy::ControlTypes controlTypes2;
    int fixedSpacing = q->spacing();
    int previousNonEmptyIndex = -1;

    QStyle *style = nullptr;
    if (fixedSpacing < 0) {
        if (QWidget *parentWidget = q->parentWidget())
            style = parentWidget->style();
    }

    for (int i = 0; i < n; i++) {
        QBoxLayoutItem *box = list.at(i);
        QSize max = box->item->maximumSize();
        QSize min = box->item->minimumSize();
        QSize hint = box->item->sizeHint();
        Qt::Orientations exp = box->item->expandingDirections();
        bool empty = box->item->isEmpty();
        int spacing = 0;

        if (!empty) {
            if (fixedSpacing >= 0) {
                spacing = (previousNonEmptyIndex >= 0) ? fixedSpacing : 0;
#ifdef Q_OS_MAC
                if (!horz(dir) && previousNonEmptyIndex >= 0) {
                    QBoxLayoutItem *sibling = (dir == QBoxLayout::TopToBottom  ? box : list.at(previousNonEmptyIndex));
                    if (sibling) {
                        QWidget *wid = sibling->item->widget();
                        if (wid)
                            spacing = qMax(spacing, sibling->item->geometry().top() - wid->geometry().top());
                    }
                }
#endif
            } else {
                controlTypes1 = controlTypes2;
                controlTypes2 = box->item->controlTypes();
                if (previousNonEmptyIndex >= 0) {
                    QSizePolicy::ControlTypes actual1 = controlTypes1;
                    QSizePolicy::ControlTypes actual2 = controlTypes2;
                    if (dir == QBoxLayout::RightToLeft || dir == QBoxLayout::BottomToTop)
                        qSwap(actual1, actual2);

                    if (style) {
                        spacing = style->combinedLayoutSpacing(actual1, actual2,
                                             horz(dir) ? Qt::Horizontal : Qt::Vertical,
                                             nullptr, q->parentWidget());
                        if (spacing < 0)
                            spacing = 0;
                    }
                }
            }

            if (previousNonEmptyIndex >= 0)
                a[previousNonEmptyIndex].spacing = spacing;
            previousNonEmptyIndex = i;
        }

        bool ignore = empty && box->item->widget(); // ignore hidden widgets
        bool dummy = true;
        if (horz(dir)) {
            bool expand = (exp & Qt::Horizontal || box->stretch > 0);
            horexp = horexp || expand;
            maxw += spacing + max.width();
            minw += spacing + min.width();
            hintw += spacing + hint.width();
            if (!ignore)
                qMaxExpCalc(maxh, verexp, dummy,
                            max.height(), exp & Qt::Vertical, box->item->isEmpty());
            minh = qMax(minh, min.height());
            hinth = qMax(hinth, hint.height());

            a[i].sizeHint = hint.width();
            a[i].maximumSize = max.width();
            a[i].minimumSize = min.width();
            a[i].expansive = expand;
            a[i].stretch = box->stretch ? box->stretch : box->hStretch();
        } else {
            bool expand = (exp & Qt::Vertical || box->stretch > 0);
            verexp = verexp || expand;
            maxh += spacing + max.height();
            minh += spacing + min.height();
            hinth += spacing + hint.height();
            if (!ignore)
                qMaxExpCalc(maxw, horexp, dummy,
                            max.width(), exp & Qt::Horizontal, box->item->isEmpty());
            minw = qMax(minw, min.width());
            hintw = qMax(hintw, hint.width());

            a[i].sizeHint = hint.height();
            a[i].maximumSize = max.height();
            a[i].minimumSize = min.height();
            a[i].expansive = expand;
            a[i].stretch = box->stretch ? box->stretch : box->vStretch();
        }

        a[i].empty = empty;
        a[i].spacing = 0;   // might be initialized with a non-zero value in a later iteration
        hasHfw = hasHfw || box->item->hasHeightForWidth();
    }

    geomArray = a;

    expanding = (Qt::Orientations)
                       ((horexp ? Qt::Horizontal : 0)
                         | (verexp ? Qt::Vertical : 0));

    minSize = QSize(minw, minh);
    maxSize = QSize(maxw, maxh).expandedTo(minSize);
    sizeHint = QSize(hintw, hinth).expandedTo(minSize).boundedTo(maxSize);

    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);
    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);
    QSize extra(left + right, top + bottom);

    minSize += extra;
    maxSize += extra;
    sizeHint += extra;

    dirty = false;
}